

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  hdr_histogram *phVar2;
  _Bool _Var3;
  int iVar4;
  int64_t iVar5;
  char *pcVar6;
  char *pcVar7;
  hdr_histogram *h;
  hdr_histogram *local_28;
  
  local_28 = (hdr_histogram *)0x0;
  iVar4 = hdr_init(1,3600000000,3,&local_28);
  pcVar6 = "Failed to allocate hdr_histogram";
  if ((iVar4 == 0) && (local_28 != (hdr_histogram *)0x0)) {
    _Var3 = compare_int64((long)local_28->counts_len,0x5c00);
    if (_Var3) {
      free(local_28);
      bVar1 = true;
      pcVar6 = (char *)0x0;
      goto LAB_0010129e;
    }
    pcVar6 = "Incorrect array length";
  }
  bVar1 = false;
LAB_0010129e:
  tests_run = tests_run + 1;
  if (bVar1) {
    local_28 = (hdr_histogram *)0x0;
    iVar4 = hdr_init(0,0x10000,2,&local_28);
    if (iVar4 == 0x16) {
      iVar4 = hdr_init(0x50,0x6e,5,&local_28);
      pcVar6 = (char *)0x0;
      if (iVar4 != 0x16) {
        pcVar6 = "Should have lowest < 2 * highest";
      }
    }
    else {
      pcVar6 = "Should not allow 0 as lowest trackable value";
    }
    tests_run = tests_run + 1;
    pcVar7 = "test_invalid_init";
    if (pcVar6 == (char *)0x0) {
      local_28 = (hdr_histogram *)0x0;
      iVar4 = hdr_init(20000000,100000000,5,&local_28);
      if (iVar4 == 0) {
        hdr_record_value_atomic(local_28,100000000);
        hdr_record_value_atomic(local_28,20000000);
        hdr_record_value_atomic(local_28,30000000);
        phVar2 = local_28;
        iVar5 = hdr_value_at_percentile(local_28,50.0);
        _Var3 = hdr_values_are_equivalent(phVar2,20000000,iVar5);
        phVar2 = local_28;
        if (_Var3) {
          iVar5 = hdr_value_at_percentile(local_28,83.33);
          _Var3 = hdr_values_are_equivalent(phVar2,30000000,iVar5);
          phVar2 = local_28;
          if (_Var3) {
            iVar5 = hdr_value_at_percentile(local_28,83.34);
            _Var3 = hdr_values_are_equivalent(phVar2,100000000,iVar5);
            phVar2 = local_28;
            if (_Var3) {
              iVar5 = hdr_value_at_percentile(local_28,99.0);
              _Var3 = hdr_values_are_equivalent(phVar2,100000000,iVar5);
              pcVar6 = (char *)0x0;
              if (!_Var3) {
                pcVar6 = "99.0% Percentile";
              }
            }
            else {
              pcVar6 = "83.34% Percentile";
            }
          }
          else {
            pcVar6 = "83.33% Percentile";
          }
        }
        else {
          pcVar6 = "50.0% Percentile";
        }
      }
      else {
        pcVar6 = "Didn\'t create";
      }
      tests_run = tests_run + 1;
      if (pcVar6 == (char *)0x0) {
        local_28 = (hdr_histogram *)0x0;
        iVar4 = hdr_alloc(36000000,-1,&local_28);
        pcVar6 = "Result was not EINVAL";
        if (iVar4 == 0x16) {
          if (local_28 == (hdr_histogram *)0x0) {
            iVar4 = hdr_alloc(36000000,6,&local_28);
            if ((iVar4 == 0x16) &&
               (pcVar6 = "Histogram was not null", local_28 == (hdr_histogram *)0x0)) {
              pcVar6 = (char *)0x0;
            }
          }
          else {
            pcVar6 = "Histogram was not null";
          }
        }
        tests_run = tests_run + 1;
        if (pcVar6 == (char *)0x0) {
          load_histograms();
          if (raw_histogram->total_count == 0x2711) {
            pcVar6 = (char *)0x0;
            if (cor_histogram->total_count != 20000) {
              pcVar6 = "Total corrected count != 20000";
            }
          }
          else {
            pcVar6 = "Total raw count != 10001";
          }
          tests_run = tests_run + 1;
          if (pcVar6 == (char *)0x0) {
            load_histograms();
            iVar5 = hdr_min(raw_histogram);
            if (iVar5 == 1000) {
              iVar5 = hdr_min(cor_histogram);
              pcVar6 = (char *)0x0;
              if (iVar5 != 1000) {
                pcVar6 = "hdr_min(cor_histogram) != 1000";
              }
            }
            else {
              pcVar6 = "hdr_min(raw_histogram) != 1000";
            }
            tests_run = tests_run + 1;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = test_get_max_value();
              tests_run = tests_run + 1;
              if (pcVar6 == (char *)0x0) {
                pcVar6 = test_percentiles();
                tests_run = tests_run + 1;
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = test_recorded_values();
                  tests_run = tests_run + 1;
                  if (pcVar6 == (char *)0x0) {
                    pcVar6 = test_linear_values();
                    tests_run = tests_run + 1;
                    if (pcVar6 == (char *)0x0) {
                      pcVar6 = test_logarithmic_values();
                      tests_run = tests_run + 1;
                      if (pcVar6 == (char *)0x0) {
                        pcVar6 = test_reset();
                        tests_run = tests_run + 1;
                        if (pcVar6 == (char *)0x0) {
                          pcVar6 = test_scaling_equivalence();
                          tests_run = tests_run + 1;
                          if (pcVar6 == (char *)0x0) {
                            pcVar6 = test_out_of_range_values();
                            tests_run = tests_run + 1;
                            if (pcVar6 == (char *)0x0) {
                              pcVar6 = test_linear_iter_buckets_correctly();
                              tests_run = tests_run + 1;
                              if (pcVar6 == (char *)0x0) {
                                pcVar6 = test_interval_recording();
                                tests_run = tests_run + 1;
                                pcVar7 = "test_interval_recording";
                                if (pcVar6 == (char *)0x0) {
                                  pcVar7 = (char *)0x0;
                                }
                              }
                              else {
                                pcVar7 = "test_linear_iter_buckets_correctly";
                              }
                            }
                            else {
                              pcVar7 = "test_out_of_range_values";
                            }
                          }
                          else {
                            pcVar7 = "test_scaling_equivalence";
                          }
                        }
                        else {
                          pcVar7 = "test_reset";
                        }
                      }
                      else {
                        pcVar7 = "test_logarithmic_values";
                      }
                    }
                    else {
                      pcVar7 = "test_linear_values";
                    }
                  }
                  else {
                    pcVar7 = "test_recorded_values";
                  }
                }
                else {
                  pcVar7 = "test_percentiles";
                }
              }
              else {
                pcVar7 = "test_get_max_value";
              }
            }
            else {
              pcVar7 = "test_get_min_value";
            }
          }
          else {
            pcVar7 = "test_total_count";
          }
        }
        else {
          pcVar7 = "test_invalid_significant_figures";
        }
      }
      else {
        pcVar7 = "test_create_with_large_values";
      }
    }
  }
  else {
    pcVar7 = "test_create";
  }
  if (pcVar6 == (char *)0x0) {
    puts("ALL TESTS PASSED");
  }
  else {
    printf("hdr_histogram_test.%s(): %s\n",pcVar7,pcVar6);
  }
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return -(uint)(pcVar6 != (char *)0x0);
}

Assistant:

int main(void)
{
    return hdr_histogram_run_tests();
}